

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void __thiscall tcu::CaseTreeNode::addChild(CaseTreeNode *this,CaseTreeNode *child)

{
  CaseTreeNode *local_8;
  
  local_8 = child;
  std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::push_back
            (&this->m_children,&local_8);
  return;
}

Assistant:

void								addChild			(CaseTreeNode* child) { m_children.push_back(child); }